

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::analysis::ConstantManager::BuildInstructionAndAddToModule
          (ConstantManager *this,Constant *new_const,inst_iterator *pos,uint32_t type_id)

{
  uint32_t uVar1;
  IRContext *pIVar2;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  size_type __dnew;
  undefined1 local_68 [32];
  spv_position_t local_48;
  
  pIVar2 = this->ctx_;
  uVar1 = Module::TakeNextIdBound
                    ((pIVar2->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar1 == 0) && ((pIVar2->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_68._0_8_ = local_68 + 0x10;
    local_48.line = 0x25;
    local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)&local_48);
    local_68._16_8_ = local_48.line;
    ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
    &((IRContext *)local_68._0_8_)->syntax_context_)->_vptr_IntrusiveNodeBase =
         (_func_int **)0x667265766f204449;
    *(undefined8 *)&((IRContext *)local_68._0_8_)->grammar_ = 0x797254202e776f6c;
    (((IRContext *)local_68._0_8_)->grammar_).operandTable_ = (spv_operand_table)0x676e696e6e757220;
    (((IRContext *)local_68._0_8_)->grammar_).opcodeTable_ = (spv_opcode_table)0x746361706d6f6320;
    *(undefined8 *)((long)&(((IRContext *)local_68._0_8_)->grammar_).opcodeTable_ + 5) =
         0x2e7364692d746361;
    local_68._8_8_ = local_48.line;
    *(char *)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                     &((IRContext *)local_68._0_8_)->syntax_context_)->_vptr_IntrusiveNodeBase +
             local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar2->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_68._0_8_);
    if ((IRContext *)local_68._0_8_ != (IRContext *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if (uVar1 == 0) {
    pIVar2 = (IRContext *)0x0;
  }
  else {
    CreateInstruction((ConstantManager *)local_68,(uint32_t)this,(Constant *)(ulong)uVar1,
                      (uint32_t)new_const);
    pIVar2 = (IRContext *)local_68._0_8_;
    if ((IRContext *)local_68._0_8_ == (IRContext *)0x0) {
      pIVar2 = (IRContext *)0x0;
    }
    else {
      InstructionList::iterator::InsertBefore
                ((iterator *)&local_48,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)pos);
      (pos->super_iterator).node_ = (Instruction *)local_48.line;
      (pos->super_iterator).node_ =
           ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_48.line)->next_node_;
      if ((this->ctx_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        DefUseManager::AnalyzeInstDefUse
                  ((this->ctx_->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,(Instruction *)pIVar2);
      }
      MapConstantToInst(this,new_const,(Instruction *)pIVar2);
    }
    if ((IRContext *)local_68._0_8_ != (IRContext *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_68._0_8_)->_vptr_IntrusiveNodeBase
        [1])();
    }
  }
  return (Instruction *)pIVar2;
}

Assistant:

Instruction* ConstantManager::BuildInstructionAndAddToModule(
    const Constant* new_const, Module::inst_iterator* pos, uint32_t type_id) {
  // TODO(1841): Handle id overflow.
  uint32_t new_id = context()->TakeNextId();
  if (new_id == 0) {
    return nullptr;
  }

  auto new_inst = CreateInstruction(new_id, new_const, type_id);
  if (!new_inst) {
    return nullptr;
  }
  auto* new_inst_ptr = new_inst.get();
  *pos = pos->InsertBefore(std::move(new_inst));
  ++(*pos);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(new_inst_ptr);
  MapConstantToInst(new_const, new_inst_ptr);
  return new_inst_ptr;
}